

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_wav_preinit_write
                    (ma_dr_wav *pWav,ma_dr_wav_data_format *pFormat,ma_bool32 isSequential,
                    ma_dr_wav_write_proc onWrite,ma_dr_wav_seek_proc onSeek,void *pUserData,
                    ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_uint32 mVar1;
  ma_uint32 mVar2;
  ma_uint32 mVar3;
  uint uVar4;
  code *pcVar5;
  code *pcVar6;
  code *pcVar7;
  void *pvVar8;
  ma_bool32 mVar9;
  ma_bool32 mVar10;
  
  mVar9 = 0;
  mVar10 = 0;
  if ((((onWrite != (ma_dr_wav_write_proc)0x0 && pWav != (ma_dr_wav *)0x0) &&
       (isSequential != 0 || onSeek != (ma_dr_wav_seek_proc)0x0)) &&
      (mVar1 = pFormat->format, mVar10 = mVar9, mVar1 != 2)) &&
     ((mVar1 != 0x11 && (mVar1 != 0xfffe)))) {
    mVar10 = 0;
    memset(pWav,0,400);
    pWav->onWrite = onWrite;
    pWav->onSeek = onSeek;
    pWav->pUserData = pUserData;
    if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      pcVar5 = ma_dr_wav__malloc_default;
      pcVar6 = ma_dr_wav__realloc_default;
      pcVar7 = ma_dr_wav__free_default;
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = pAllocationCallbacks->pUserData;
      pcVar5 = pAllocationCallbacks->onMalloc;
      pcVar6 = pAllocationCallbacks->onRealloc;
      pcVar7 = pAllocationCallbacks->onFree;
    }
    (pWav->allocationCallbacks).pUserData = pvVar8;
    (pWav->allocationCallbacks).onMalloc = pcVar5;
    (pWav->allocationCallbacks).onRealloc = pcVar6;
    (pWav->allocationCallbacks).onFree = pcVar7;
    if ((pcVar7 != (_func_void_void_ptr_void_ptr *)0x0) &&
       (pcVar5 != (_func_void_ptr_size_t_void_ptr *)0x0 ||
        pcVar6 != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0)) {
      (pWav->fmt).formatTag = (ma_uint16)pFormat->format;
      mVar1 = pFormat->channels;
      (pWav->fmt).channels = (ma_uint16)mVar1;
      mVar2 = pFormat->sampleRate;
      (pWav->fmt).sampleRate = mVar2;
      mVar3 = pFormat->bitsPerSample;
      uVar4 = mVar1 * mVar3;
      (pWav->fmt).avgBytesPerSec = mVar2 * uVar4 >> 3;
      (pWav->fmt).blockAlign = (ma_uint16)(uVar4 >> 3);
      (pWav->fmt).bitsPerSample = (ma_uint16)mVar3;
      pWav->isSequentialWrite = isSequential;
      mVar10 = 1;
    }
  }
  return mVar10;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_preinit_write(ma_dr_wav* pWav, const ma_dr_wav_data_format* pFormat, ma_bool32 isSequential, ma_dr_wav_write_proc onWrite, ma_dr_wav_seek_proc onSeek, void* pUserData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pWav == NULL || onWrite == NULL) {
        return MA_FALSE;
    }
    if (!isSequential && onSeek == NULL) {
        return MA_FALSE;
    }
    if (pFormat->format == MA_DR_WAVE_FORMAT_EXTENSIBLE) {
        return MA_FALSE;
    }
    if (pFormat->format == MA_DR_WAVE_FORMAT_ADPCM || pFormat->format == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
        return MA_FALSE;
    }
    MA_DR_WAV_ZERO_MEMORY(pWav, sizeof(*pWav));
    pWav->onWrite   = onWrite;
    pWav->onSeek    = onSeek;
    pWav->pUserData = pUserData;
    pWav->allocationCallbacks = ma_dr_wav_copy_allocation_callbacks_or_defaults(pAllocationCallbacks);
    if (pWav->allocationCallbacks.onFree == NULL || (pWav->allocationCallbacks.onMalloc == NULL && pWav->allocationCallbacks.onRealloc == NULL)) {
        return MA_FALSE;
    }
    pWav->fmt.formatTag = (ma_uint16)pFormat->format;
    pWav->fmt.channels = (ma_uint16)pFormat->channels;
    pWav->fmt.sampleRate = pFormat->sampleRate;
    pWav->fmt.avgBytesPerSec = (ma_uint32)((pFormat->bitsPerSample * pFormat->sampleRate * pFormat->channels) / 8);
    pWav->fmt.blockAlign = (ma_uint16)((pFormat->channels * pFormat->bitsPerSample) / 8);
    pWav->fmt.bitsPerSample = (ma_uint16)pFormat->bitsPerSample;
    pWav->fmt.extendedSize = 0;
    pWav->isSequentialWrite = isSequential;
    return MA_TRUE;
}